

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdeadlinetimer.h
# Opt level: O0

nanoseconds __thiscall QDeadlineTimer::remainingTimeAsDuration(QDeadlineTimer *this)

{
  bool bVar1;
  long in_FS_OFFSET;
  qint64 nsecs;
  QDeadlineTimer *in_stack_ffffffffffffffd0;
  long local_18;
  rep local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = isForever(in_stack_ffffffffffffffd0);
  if (bVar1) {
    local_10 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::max();
  }
  else {
    local_18 = QDeadlineTimer::rawRemainingTimeNSecs();
    if (local_18 < 1) {
      local_10 = (rep)std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>::zero();
    }
    else {
      std::chrono::duration<long,std::ratio<1l,1000000000l>>::duration<long_long,void>
                ((duration<long,std::ratio<1l,1000000000l>> *)&local_10,&local_18);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (nanoseconds)local_10;
  }
  __stack_chk_fail();
}

Assistant:

std::chrono::nanoseconds remainingTimeAsDuration() const noexcept
    {
        if (isForever())
            return std::chrono::nanoseconds::max();
        qint64 nsecs = rawRemainingTimeNSecs();
        if (nsecs <= 0)
            return std::chrono::nanoseconds::zero();
        return std::chrono::nanoseconds(nsecs);
    }